

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddUnate.c
# Opt level: O0

Extra_UnateInfo_t * Extra_UnateInfoAllocate(int nVars)

{
  Extra_UnateInfo_t *__s;
  Extra_UnateVar_t *pEVar1;
  Extra_UnateInfo_t *p;
  int nVars_local;
  
  __s = (Extra_UnateInfo_t *)malloc(0x18);
  memset(__s,0,0x18);
  __s->nVars = nVars;
  pEVar1 = (Extra_UnateVar_t *)malloc((long)nVars << 2);
  __s->pVars = pEVar1;
  memset(__s->pVars,0,(long)nVars << 2);
  return __s;
}

Assistant:

Extra_UnateInfo_t *  Extra_UnateInfoAllocate( int nVars )
{
    Extra_UnateInfo_t * p;
    // allocate and clean the storage for unateness info
    p = ABC_ALLOC( Extra_UnateInfo_t, 1 );
    memset( p, 0, sizeof(Extra_UnateInfo_t) );
    p->nVars     = nVars;
    p->pVars     = ABC_ALLOC( Extra_UnateVar_t, nVars );  
    memset( p->pVars, 0, nVars * sizeof(Extra_UnateVar_t) );
    return p;
}